

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O3

SBuf * lj_buf_puttab(SBuf *sb,GCtab *t,GCstr *sep,int32_t i,int32_t e)

{
  uint uVar1;
  uint uVar2;
  uint sz;
  SBuf *pSVar3;
  long lVar4;
  ulong uVar5;
  cTValue *pcVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  size_t local_58;
  
  if (sep == (GCstr *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = (size_t)sep->len;
  }
  if (e < i) {
    return sb;
  }
  lVar4 = (long)e - (long)i;
  lVar7 = (long)i << 3;
  do {
    if ((uint)i < t->asize) {
      pcVar6 = (cTValue *)((ulong)(t->array).ptr32 + lVar7);
    }
    else {
      pcVar6 = lj_tab_getinth(t,i);
    }
    if (pcVar6 == (cTValue *)0x0) {
LAB_00111693:
      pSVar3 = (SBuf *)0x0;
      goto LAB_0011169d;
    }
    sz = (uint)local_58;
    if ((pcVar6->field_2).it == 0xfffffffb) {
      uVar5 = (ulong)(pcVar6->u32).lo;
      uVar1 = *(uint *)(uVar5 + 0xc);
      uVar2 = (sb->p).ptr32;
      pcVar8 = (char *)(ulong)uVar2;
      if ((sb->e).ptr32 - uVar2 < sz + uVar1) {
        pcVar8 = lj_buf_more2(sb,sz + uVar1);
        uVar5 = (ulong)(pcVar6->u32).lo;
      }
      memcpy(pcVar8,(void *)(uVar5 + 0x10),(ulong)uVar1);
      pcVar8 = pcVar8 + uVar1;
    }
    else {
      if (0xfffefffe < (pcVar6->field_2).it) goto LAB_00111693;
      pSVar3 = lj_strfmt_putfnum(sb,0xf000035,pcVar6->n);
      uVar1 = (pSVar3->p).ptr32;
      pcVar8 = (char *)(ulong)uVar1;
      if ((pSVar3->e).ptr32 - uVar1 < sz) {
        pcVar8 = lj_buf_more2(pSVar3,sz);
      }
    }
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar9) {
      i = (int32_t)pcVar8;
      pSVar3 = sb;
LAB_0011169d:
      (sb->p).ptr32 = i;
      return pSVar3;
    }
    if (sz != 0) {
      memcpy(pcVar8,sep + 1,local_58);
      pcVar8 = pcVar8 + local_58;
    }
    (sb->p).ptr32 = (uint32_t)pcVar8;
    lVar7 = lVar7 + 8;
    i = i + 1;
  } while( true );
}

Assistant:

SBuf *lj_buf_puttab(SBuf *sb, GCtab *t, GCstr *sep, int32_t i, int32_t e)
{
  MSize seplen = sep ? sep->len : 0;
  if (i <= e) {
    for (;;) {
      cTValue *o = lj_tab_getint(t, i);
      char *p;
      if (!o) {
      badtype:  /* Error: bad element type. */
	setsbufP(sb, (void *)(intptr_t)i);  /* Store failing index. */
	return NULL;
      } else if (tvisstr(o)) {
	MSize len = strV(o)->len;
	p = lj_buf_wmem(lj_buf_more(sb, len + seplen), strVdata(o), len);
      } else if (tvisint(o)) {
	p = lj_strfmt_wint(lj_buf_more(sb, STRFMT_MAXBUF_INT+seplen), intV(o));
      } else if (tvisnum(o)) {
	p = lj_buf_more(lj_strfmt_putfnum(sb, STRFMT_G14, numV(o)), seplen);
      } else {
	goto badtype;
      }
      if (i++ == e) {
	setsbufP(sb, p);
	break;
      }
      if (seplen) p = lj_buf_wmem(p, strdata(sep), seplen);
      setsbufP(sb, p);
    }
  }
  return sb;
}